

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> * __thiscall
bssl::InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator=
          (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this,
          InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *other)

{
  clear(this);
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<std::vector<int,std::allocator<int>>*>,std::vector<int,std::allocator<int>>*>
            ((move_iterator<std::vector<int,_std::allocator<int>_>_*>)other,
             (vector<int,_std::allocator<int>_> *)(other->storage_ + (ulong)other->size_ * 0x18),
             (vector<int,_std::allocator<int>_> *)this);
  this->size_ = other->size_;
  return this;
}

Assistant:

InplaceVector &operator=(InplaceVector &&other) {
    clear();
    std::uninitialized_move(other.begin(), other.end(), data());
    size_ = other.size();
    return *this;
  }